

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_loadDictHC(LZ4_streamHC_t *LZ4_streamHCPtr,char *dictionary,int dictSize)

{
  short sVar1;
  LZ4_byte *pLVar2;
  uint uVar3;
  U32 UVar4;
  int cLevel;
  LZ4HC_CCtx_internal *ctxPtr;
  BYTE *pBStack_58;
  int dictSize_local;
  char *dictionary_local;
  LZ4_streamHC_t *LZ4_streamHCPtr_local;
  size_t delta;
  uint local_38;
  U32 h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 *hashTable;
  U16 *chainTable;
  
  ctxPtr._4_4_ = dictSize;
  pBStack_58 = (BYTE *)dictionary;
  if (0x10000 < dictSize) {
    pBStack_58 = (BYTE *)(dictionary + (long)dictSize + -0x10000);
    ctxPtr._4_4_ = 0x10000;
  }
  sVar1 = (LZ4_streamHCPtr->internal_donotuse).compressionLevel;
  LZ4_initStreamHC(LZ4_streamHCPtr,0x40038);
  LZ4_setCompressionLevel(LZ4_streamHCPtr,(int)sVar1);
  LZ4HC_init_internal(&LZ4_streamHCPtr->internal_donotuse,pBStack_58);
  LZ4_streamHCPtr->table[0x8000] = pBStack_58 + ctxPtr._4_4_;
  if (3 < ctxPtr._4_4_) {
    pLVar2 = (LZ4_streamHCPtr->internal_donotuse).base;
    uVar3 = ((int)LZ4_streamHCPtr->table[0x8000] + -3) - (int)pLVar2;
    for (local_38 = (LZ4_streamHCPtr->internal_donotuse).nextToUpdate; local_38 < uVar3;
        local_38 = local_38 + 1) {
      UVar4 = LZ4HC_hashPtr(pLVar2 + local_38);
      LZ4_streamHCPtr_local =
           (LZ4_streamHC_t *)(ulong)(local_38 - *(int *)((long)LZ4_streamHCPtr + (ulong)UVar4 * 4));
      if ((LZ4_streamHC_t *)0xffff < LZ4_streamHCPtr_local) {
        LZ4_streamHCPtr_local = (LZ4_streamHC_t *)0xffff;
      }
      *(short *)((long)LZ4_streamHCPtr + (ulong)(local_38 & 0xffff) * 2 + 0x20000) =
           (short)LZ4_streamHCPtr_local;
      *(uint *)((long)LZ4_streamHCPtr + (ulong)UVar4 * 4) = local_38;
    }
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = uVar3;
  }
  return ctxPtr._4_4_;
}

Assistant:

int LZ4_loadDictHC (LZ4_streamHC_t* LZ4_streamHCPtr,
              const char* dictionary, int dictSize)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(4, "LZ4_loadDictHC(ctx:%p, dict:%p, dictSize:%d)", LZ4_streamHCPtr, dictionary, dictSize);
    assert(LZ4_streamHCPtr != NULL);
    if (dictSize > 64 KB) {
        dictionary += (size_t)dictSize - 64 KB;
        dictSize = 64 KB;
    }
    /* need a full initialization, there are bad side-effects when using resetFast() */
    {   int const cLevel = ctxPtr->compressionLevel;
        LZ4_initStreamHC(LZ4_streamHCPtr, sizeof(*LZ4_streamHCPtr));
        LZ4_setCompressionLevel(LZ4_streamHCPtr, cLevel);
    }
    LZ4HC_init_internal (ctxPtr, (const BYTE*)dictionary);
    ctxPtr->end = (const BYTE*)dictionary + dictSize;
    if (dictSize >= 4) LZ4HC_Insert (ctxPtr, ctxPtr->end-3);
    return dictSize;
}